

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Annotation.cpp
# Opt level: O0

Annotation * __thiscall soul::Annotation::operator=(Annotation *this,Annotation *other)

{
  bool bVar1;
  pointer local_18;
  Annotation *other_local;
  Annotation *this_local;
  
  local_18 = (pointer)other;
  other_local = this;
  bVar1 = std::operator!=(&other->properties,(nullptr_t)0x0);
  if (bVar1) {
    std::
    unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    ::operator*((unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
                 *)local_18);
    std::
    make_unique<std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>,std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>&>
              ((vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *)
               &stack0xffffffffffffffe0);
    std::
    unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    ::operator=(&this->properties,
                (unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
                 *)&stack0xffffffffffffffe0);
    std::
    unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
                   *)&stack0xffffffffffffffe0);
  }
  StringDictionary::operator=
            (&this->dictionary,(StringDictionary *)&(local_18->name)._M_string_length);
  return this;
}

Assistant:

Annotation& Annotation::operator= (const Annotation& other)
{
    if (other.properties != nullptr)
        properties = std::make_unique<std::vector<Property>> (*other.properties);

    dictionary = other.dictionary;
    return *this;
}